

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::printTestFilters(ConsoleReporter *this)

{
  long lVar1;
  bool bVar2;
  element_type *peVar3;
  ostream *poVar4;
  long in_RDI;
  long in_FS_OFFSET;
  Colour guard;
  Code in_stack_ffffffffffffff8c;
  Colour *in_stack_ffffffffffffff90;
  string local_28 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  peVar3 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x24fa0a);
  (*(peVar3->super_NonCopyable)._vptr_NonCopyable[0xd])();
  bVar2 = TestSpec::hasFilters((TestSpec *)0x24fa1b);
  if (bVar2) {
    Colour::Colour(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    poVar4 = std::operator<<(*(ostream **)(in_RDI + 0x18),"Filters: ");
    peVar3 = clara::std::
             __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x24fa5d);
    (*(peVar3->super_NonCopyable)._vptr_NonCopyable[0xf])();
    serializeFilters(in_stack_ffffffffffffffe8);
    poVar4 = std::operator<<(poVar4,local_28);
    std::operator<<(poVar4,'\n');
    std::__cxx11::string::~string(local_28);
    Colour::~Colour((Colour *)0x24fabc);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ConsoleReporter::printTestFilters() {
    if (m_config->testSpec().hasFilters()) {
        Colour guard(Colour::BrightYellow);
        stream << "Filters: " << serializeFilters(m_config->getTestsOrTags()) << '\n';
    }
}